

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this)

{
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->java_package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->java_outer_classname_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->optimize_for_ = 1;
  this->java_multiple_files_ = false;
  this->java_generate_equals_and_hash_ = false;
  this->cc_generic_services_ = false;
  this->java_generic_services_ = false;
  this->go_package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->py_generic_services_ = false;
  return;
}

Assistant:

void FileOptions::SharedCtor() {
  _cached_size_ = 0;
  java_package_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  java_outer_classname_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  java_multiple_files_ = false;
  java_generate_equals_and_hash_ = false;
  optimize_for_ = 1;
  go_package_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  cc_generic_services_ = false;
  java_generic_services_ = false;
  py_generic_services_ = false;
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}